

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void R_DrawTranslatedColumnP_C(void)

{
  lighttable_t *plVar1;
  fixed_t fVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  int iVar5;
  BYTE *pBVar6;
  fixed_t fVar7;
  long lVar8;
  
  pBVar4 = dc_translation;
  pBVar3 = dc_source;
  fVar2 = dc_iscale;
  plVar1 = dc_colormap;
  if (0 < dc_count) {
    lVar8 = (long)dc_pitch;
    pBVar6 = dc_dest;
    iVar5 = dc_count;
    fVar7 = dc_texturefrac;
    do {
      *pBVar6 = plVar1[pBVar4[pBVar3[fVar7 >> 0x10]]];
      pBVar6 = pBVar6 + lVar8;
      fVar7 = fVar7 + fVar2;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

void R_DrawTranslatedColumnP_C (void)
{ 
	int 				count;
	BYTE*				dest;
	fixed_t 			frac;
	fixed_t 			fracstep;

	count = dc_count;
	if (count <= 0) 
		return;

	dest = dc_dest;

	fracstep = dc_iscale;
	frac = dc_texturefrac;

	{
		// [RH] Local copies of global vars to improve compiler optimizations
		BYTE *colormap = dc_colormap;
		BYTE *translation = dc_translation;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;

		do
		{
			*dest = colormap[translation[source[frac>>FRACBITS]]];
			dest += pitch;

			frac += fracstep;
		} while (--count);
	}
}